

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

uint __thiscall
Strings::VerySimpleReadOnlyString::reverseFind
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *needle,uint pos)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar1 = needle->length;
  uVar2 = this->length;
  if ((int)uVar1 <= (int)uVar2) {
    uVar5 = uVar2 - uVar1;
    if (pos < uVar2 - uVar1) {
      uVar5 = pos;
    }
    do {
      uVar4 = 0;
      while (needle->data[uVar4] == this->data[uVar5 + (int)uVar4]) {
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
        if (uVar1 <= uVar3) {
          return uVar5;
        }
      }
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar6);
  }
  return uVar2;
}

Assistant:

const unsigned int VerySimpleReadOnlyString::reverseFind(const VerySimpleReadOnlyString & needle, unsigned int pos) const
    {
        if (needle.length > length) return length;
        unsigned int i = min(pos, (unsigned int)(length - needle.length)); // If there is no space to find out the needle at the end, simply snap back
	    for (unsigned int j = 0;;)
	    {
		    if (needle.data[j] == data[i + j])
		    {
			    j ++;
			    if (j >= (unsigned int)needle.length) return i;
		    } else
		    {
			    if (i-- == 0) break;
			    j = 0;
		    }
	    }
        return length;
    }